

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_schemas.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultSchemaGenerator::CreateDefaultEntry
          (DefaultSchemaGenerator *this,CatalogTransaction transaction,string *entry_name)

{
  bool bVar1;
  string *in_RDX;
  string sStack_168;
  undefined1 local_148 [82];
  bool local_f6;
  
  bVar1 = IsDefaultSchema(in_RDX);
  if (bVar1) {
    CreateSchemaInfo::CreateSchemaInfo((CreateSchemaInfo *)local_148);
    StringUtil::Lower(&sStack_168,in_RDX);
    ::std::__cxx11::string::operator=((string *)(local_148 + 0x30),(string *)&sStack_168);
    ::std::__cxx11::string::~string((string *)&sStack_168);
    local_f6 = true;
    make_uniq_base<duckdb::CatalogEntry,duckdb::DuckSchemaEntry,duckdb::Catalog&,duckdb::CreateSchemaInfo&>
              ((duckdb *)this,(Catalog *)entry_name->_M_string_length,(CreateSchemaInfo *)local_148)
    ;
    CreateInfo::~CreateInfo((CreateInfo *)local_148);
  }
  else {
    (this->super_DefaultGenerator)._vptr_DefaultGenerator = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DefaultSchemaGenerator::CreateDefaultEntry(CatalogTransaction transaction,
                                                                    const string &entry_name) {
	if (IsDefaultSchema(entry_name)) {
		CreateSchemaInfo info;
		info.schema = StringUtil::Lower(entry_name);
		info.internal = true;
		return make_uniq_base<CatalogEntry, DuckSchemaEntry>(catalog, info);
	}
	return nullptr;
}